

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyDebugNamesCULists(DWARFVerifier *this,DWARFDebugNames *AccelTable)

{
  uint uVar1;
  DWARFContext *pDVar2;
  void *pvVar3;
  value_type *pvVar4;
  ulong uVar5;
  pointer pvVar6;
  raw_ostream *prVar7;
  long lVar8;
  size_type NumEntries;
  undefined1 in_R8B;
  uint32_t uVar9;
  unsigned_long *puVar10;
  NameIndex *this_00;
  unsigned_long *puVar11;
  iterator iVar12;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
  local_128;
  NameIndex *local_b8;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
  local_b0;
  _func_int **local_80;
  DWARFDebugNames *local_78;
  _func_int **local_70;
  unsigned_long *local_68;
  uint64_t Offset;
  unsigned_long *local_58;
  undefined8 uStack_50;
  uint local_48;
  DWARFVerifier *local_40;
  ulong local_38;
  
  local_58 = (unsigned_long *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  pDVar2 = this->DCtx;
  local_40 = this;
  DWARFContext::parseNormalUnits(pDVar2);
  NumEntries = (pDVar2->NormalUnits).NumInfoUnits;
  if (NumEntries == 0xffffffff) {
    NumEntries = (pDVar2->NormalUnits).
                 super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                 .
                 super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
                 .
                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 .super_SmallVectorBase.Size;
  }
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::reserve((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             *)&local_58,NumEntries);
  pDVar2 = local_40->DCtx;
  local_78 = AccelTable;
  DWARFContext::parseNormalUnits(pDVar2);
  uVar1 = (pDVar2->NormalUnits).NumInfoUnits;
  if (uVar1 == 0xffffffff) {
    uVar1 = (pDVar2->NormalUnits).
            super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
            .
            super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
            .
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
  }
  if (uVar1 != 0) {
    pvVar3 = (pDVar2->NormalUnits).
             super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
             .
             super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
             .
             super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             .
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             .super_SmallVectorBase.BeginX;
    lVar8 = 0;
    do {
      local_128.super_formatv_object_base.Fmt.Data =
           *(char **)(*(long *)((long)pvVar3 + lVar8) + 0x18);
      pvVar4 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
               ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                                   *)&local_58,(unsigned_long *)&local_128);
      (pvVar4->super_pair<unsigned_long,_unsigned_long>).second = 0xffffffffffffffff;
      lVar8 = lVar8 + 8;
    } while ((ulong)uVar1 * 8 != lVar8);
  }
  uVar5 = (ulong)(local_78->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                 super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
                 super_SmallVectorBase.Size;
  if (uVar5 == 0) {
    local_38 = 0;
  }
  else {
    this_00 = (NameIndex *)
              (local_78->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
              super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
              super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
              super_SmallVectorBase.BeginX;
    local_b8 = this_00 + uVar5;
    local_38 = 0;
    local_70 = (_func_int **)&PTR_anchor_00d8d168;
    local_80 = (_func_int **)&PTR_anchor_00d8d3f8;
    do {
      uVar9 = (this_00->Hdr).super_HeaderPOD.CompUnitCount;
      local_78 = (DWARFDebugNames *)CONCAT44(local_78._4_4_,uVar9);
      if (uVar9 == 0) {
        prVar7 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xbe8acc,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.Item = (unsigned_long *)this_00->Base;
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter = local_70;
        Fmt_01.Length = 0x29;
        Fmt_01.Data = "Name Index @ {0:x} does not index any CU\n";
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
        formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>
                        *)&local_128,Fmt_01,
                       (tuple<llvm::detail::provider_format_adapter<unsigned_long>_> *)&local_b0);
        raw_ostream::operator<<(prVar7,&local_128.super_formatv_object_base);
        if (local_128.super_formatv_object_base.Replacements.
            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_128.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_128.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_128.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_38 = (ulong)((int)local_38 + 1);
      }
      else {
        uVar9 = 0;
        do {
          local_68 = (unsigned_long *)DWARFDebugNames::NameIndex::getCUOffset(this_00,uVar9);
          iVar12 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                   ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                           *)&local_58,(const_arg_type_t<unsigned_long>)&stack0xffffffffffffff98);
          pvVar6 = iVar12.Ptr;
          if (pvVar6 == (pointer)(local_58 + (ulong)local_48 * 2)) {
            prVar7 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xbe8acc,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.Item = (unsigned_long *)this_00->Base;
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.super_format_adapter._vptr_format_adapter = local_80;
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
            super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.Item = (unsigned_long *)&stack0xffffffffffffff98;
            local_b0.
            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .
            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
            .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
            _M_head_impl.super_format_adapter._vptr_format_adapter = local_70;
            Fmt_00.Length = 0x38;
            Fmt_00.Data = "Name Index @ {0:x} references a non-existing CU @ {1:x}\n";
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
            ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                              *)&local_128,Fmt_00,
                             (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
                              *)&local_b0);
            raw_ostream::operator<<(prVar7,&local_128.super_formatv_object_base);
            if (local_128.super_formatv_object_base.Replacements.
                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_128.super_formatv_object_base.Replacements.
                              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_128.super_formatv_object_base.Replacements.
                                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_128.super_formatv_object_base.Replacements.
                                    super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_128.super_formatv_object_base.Adapters.
                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_128.super_formatv_object_base.Adapters.
                              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_128.super_formatv_object_base.Adapters.
                                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_128.super_formatv_object_base.Adapters.
                                    super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_38 = (ulong)((int)local_38 + 1);
          }
          else {
            puVar10 = &(pvVar6->super_pair<unsigned_long,_unsigned_long>).second;
            if ((pvVar6->super_pair<unsigned_long,_unsigned_long>).second == 0xffffffffffffffff) {
              *puVar10 = this_00->Base;
            }
            else {
              prVar7 = WithColor::error((WithColor *)local_40->OS,(raw_ostream *)0xbe8acc,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
              _M_head_impl.Item = this_00->Base;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
              super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.super_format_adapter._vptr_format_adapter = local_80;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.super_format_adapter._vptr_format_adapter = local_80;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.Item = (unsigned_long *)&stack0xffffffffffffff98;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
              _M_head_impl.super_format_adapter._vptr_format_adapter = local_70;
              Fmt.Length = 0x61;
              Fmt.Data = 
              "Name Index @ {0:x} references a CU @ {1:x}, but this CU is already indexed by Name Index @ {2:x}\n"
              ;
              local_b0.
              super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .
              super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
              .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
              super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
              _M_head_impl.Item = puVar10;
              formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
              ::formatv_object(&local_128,Fmt,&local_b0);
              raw_ostream::operator<<(prVar7,&local_128.super_formatv_object_base);
              if (local_128.super_formatv_object_base.Replacements.
                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_128.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_128.super_formatv_object_base.Replacements.
                                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_128.super_formatv_object_base.Replacements.
                                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_128.super_formatv_object_base.Adapters.
                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_128.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_128.super_formatv_object_base.Adapters.
                                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_128.super_formatv_object_base.Adapters.
                                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
          uVar9 = uVar9 + 1;
        } while ((uint32_t)local_78 != uVar9);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_b8);
  }
  Offset = (uint64_t)(local_58 + (ulong)local_48 * 2);
  puVar10 = (unsigned_long *)Offset;
  if ((int)uStack_50 != 0) {
    local_128.super_formatv_object_base.Fmt.Data = (char *)local_58;
    local_128.super_formatv_object_base.Fmt.Length = Offset;
    DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
    ::AdvancePastEmptyBuckets
              ((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                *)&local_128);
    Offset = local_128.super_formatv_object_base.Fmt.Length;
    puVar10 = (unsigned_long *)local_128.super_formatv_object_base.Fmt.Data;
  }
  puVar11 = local_58 + (ulong)local_48 * 2;
  local_68 = puVar10;
  if (puVar10 != puVar11) {
    do {
      puVar10 = local_68;
      if (local_68[1] == -1) {
        prVar7 = WithColor::warning((WithColor *)local_40->OS,(raw_ostream *)0xbe8acc,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d8d1c8;
        Fmt_02.Length = 0x29;
        Fmt_02.Data = "CU @ {0:x} not covered by any Name Index\n";
        local_b0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.Item = puVar10;
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>::
        formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
                        *)&local_128,Fmt_02,
                       (tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_> *)
                       &local_b0);
        raw_ostream::operator<<(prVar7,&local_128.super_formatv_object_base);
        if (local_128.super_formatv_object_base.Replacements.
            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.super_formatv_object_base.Replacements.
                          super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_128.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.super_formatv_object_base.Replacements.
                                super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_128.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.super_formatv_object_base.Adapters.
                          super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_128.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.super_formatv_object_base.Adapters.
                                super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      local_68 = local_68 + 2;
      DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
      ::AdvancePastEmptyBuckets
                ((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                  *)&stack0xffffffffffffff98);
    } while (local_68 != puVar11);
  }
  operator_delete(local_58,(ulong)local_48 << 4,8);
  return (uint)local_38;
}

Assistant:

unsigned
DWARFVerifier::verifyDebugNamesCULists(const DWARFDebugNames &AccelTable) {
  // A map from CU offset to the (first) Name Index offset which claims to index
  // this CU.
  DenseMap<uint64_t, uint64_t> CUMap;
  const uint64_t NotIndexed = std::numeric_limits<uint64_t>::max();

  CUMap.reserve(DCtx.getNumCompileUnits());
  for (const auto &CU : DCtx.compile_units())
    CUMap[CU->getOffset()] = NotIndexed;

  unsigned NumErrors = 0;
  for (const DWARFDebugNames::NameIndex &NI : AccelTable) {
    if (NI.getCUCount() == 0) {
      error() << formatv("Name Index @ {0:x} does not index any CU\n",
                         NI.getUnitOffset());
      ++NumErrors;
      continue;
    }
    for (uint32_t CU = 0, End = NI.getCUCount(); CU < End; ++CU) {
      uint64_t Offset = NI.getCUOffset(CU);
      auto Iter = CUMap.find(Offset);

      if (Iter == CUMap.end()) {
        error() << formatv(
            "Name Index @ {0:x} references a non-existing CU @ {1:x}\n",
            NI.getUnitOffset(), Offset);
        ++NumErrors;
        continue;
      }

      if (Iter->second != NotIndexed) {
        error() << formatv("Name Index @ {0:x} references a CU @ {1:x}, but "
                           "this CU is already indexed by Name Index @ {2:x}\n",
                           NI.getUnitOffset(), Offset, Iter->second);
        continue;
      }
      Iter->second = NI.getUnitOffset();
    }
  }

  for (const auto &KV : CUMap) {
    if (KV.second == NotIndexed)
      warn() << formatv("CU @ {0:x} not covered by any Name Index\n", KV.first);
  }

  return NumErrors;
}